

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O3

int Cudd_PrintLinear(DdManager *table)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long local_60;
  
  iVar1 = table->linearSize;
  if (0 < (long)iVar1) {
    iVar3 = iVar1 + -1 >> 6;
    uVar4 = iVar3 + 1;
    local_60 = 0;
    do {
      if (-1 < iVar3) {
        uVar6 = 0;
        do {
          lVar5 = table->linear[uVar6 + local_60 * (int)uVar4];
          iVar7 = 0x40;
          do {
            iVar2 = fprintf((FILE *)table->out,"%ld",(ulong)((uint)lVar5 & 1));
            if (iVar2 == 0) {
              return 0;
            }
            lVar5 = lVar5 >> 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar4);
      }
      iVar7 = fprintf((FILE *)table->out,"\n");
      if (iVar7 == 0) {
        return 0;
      }
      local_60 = local_60 + 1;
    } while (local_60 != iVar1);
  }
  return 1;
}

Assistant:

int
Cudd_PrintLinear(
  DdManager * table)
{
    int i,j,k;
    int retval;
    int nvars = table->linearSize;
    int wordsPerRow = ((nvars - 1) >> LOGBPL) + 1;
    long word;

    for (i = 0; i < nvars; i++) {
        for (j = 0; j < wordsPerRow; j++) {
            word = table->linear[i*wordsPerRow + j];
            for (k = 0; k < BPL; k++) {
                retval = fprintf(table->out,"%ld",word & 1);
                if (retval == 0) return(0);
                word >>= 1;
            }
        }
        retval = fprintf(table->out,"\n");
        if (retval == 0) return(0);
    }
    return(1);

}